

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

size_t __thiscall google::protobuf::SourceCodeInfo::ByteSizeLong(SourceCodeInfo *this)

{
  uint uVar1;
  int iVar2;
  UnknownFieldSet *unknown_fields;
  SourceCodeInfo_Location *value;
  size_t sVar3;
  uint local_30;
  int cached_size;
  uint i;
  uint count;
  size_t total_size;
  SourceCodeInfo *this_local;
  
  _i = 0;
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = SourceCodeInfo::unknown_fields(this);
    _i = internal::WireFormat::ComputeUnknownFieldsSize(unknown_fields);
  }
  uVar1 = location_size(this);
  _i = uVar1 + _i;
  for (local_30 = 0; local_30 < uVar1; local_30 = local_30 + 1) {
    value = location(this,local_30);
    sVar3 = internal::WireFormatLite::
            MessageSizeNoVirtual<google::protobuf::SourceCodeInfo_Location>(value);
    _i = sVar3 + _i;
  }
  iVar2 = internal::ToCachedSize(_i);
  this->_cached_size_ = iVar2;
  return _i;
}

Assistant:

size_t SourceCodeInfo::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.SourceCodeInfo)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  // repeated .google.protobuf.SourceCodeInfo.Location location = 1;
  {
    unsigned int count = this->location_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->location(i));
    }
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}